

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionCond.cpp
# Opt level: O0

Instruction *
Hpipe::InstructionCond::make_cond
          (Node *node,PtrPool<Hpipe::Instruction,_32> *inst_pool,Cond *not_in,bool in_a_cycle,
          InstructionMark *mark,int off_data)

{
  _WordT *this;
  double dVar1;
  Instruction *pIVar2;
  Instruction *pIVar3;
  bool bVar4;
  Node *pNVar5;
  InstructionCond *pIVar6;
  Vec<Hpipe::Transition> *pVVar7;
  Vec<unsigned_int> local_890;
  Transition local_878;
  Vec<unsigned_int> local_850;
  Transition local_838;
  Vec<unsigned_int> local_810;
  Transition local_7f8;
  Vec<unsigned_int> local_7d0;
  Transition local_7b8;
  Cond local_790;
  Cond local_770;
  Instruction *local_750;
  Instruction *ko;
  Instruction *local_728;
  Instruction *ok;
  Cond local_718;
  Context local_6f8;
  InstructionCond *local_688;
  Instruction *res;
  Transition local_668;
  Vec<unsigned_int> local_640;
  Transition local_628;
  Vec<unsigned_int> local_600;
  Transition local_5e8;
  Vec<unsigned_int> local_5c0;
  Transition local_5a8;
  Cond local_580;
  Instruction *local_560;
  Instruction *ok_3;
  Cond local_538;
  Instruction *local_518;
  Instruction *ko_3;
  Context local_508;
  InstructionCond *local_498;
  Instruction *res_3;
  Cond cond;
  Transition local_458;
  Vec<unsigned_int> local_430;
  Transition local_418;
  Vec<unsigned_int> local_3f0;
  Transition local_3d8;
  Vec<unsigned_int> local_3b0;
  Transition local_398;
  Cond local_370;
  Instruction *local_350;
  Instruction *ko_1;
  Cond local_328;
  Instruction *local_308;
  Instruction *ok_1;
  Context local_2f8;
  InstructionCond *local_288;
  Instruction *res_1;
  Transition local_268;
  Vec<unsigned_int> local_240;
  Transition local_228;
  Vec<unsigned_int> local_200;
  Transition local_1e8;
  Vec<unsigned_int> local_1c0;
  Transition local_1a8;
  Cond local_180;
  Cond local_160;
  Instruction *local_140;
  Instruction *ok_2;
  Instruction *local_118;
  Instruction *ko_2;
  Cond local_108;
  Context local_d8;
  InstructionCond *local_68;
  Instruction *res_2;
  Cond cond_1;
  bool use_neg;
  int off_data_local;
  InstructionMark *mark_local;
  bool in_a_cycle_local;
  Cond *not_in_local;
  PtrPool<Hpipe::Instruction,_32> *inst_pool_local;
  Node *node_local;
  
  cond_1.p.super__Base_bitset<4UL>._M_w[3]._4_4_ = off_data;
  bVar4 = AutoPtr::operator_cast_to_bool((AutoPtr *)&node->ok);
  if (bVar4) {
    pNVar5 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::operator->(&node->ok);
    dVar1 = pNVar5->freq;
    pNVar5 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::operator->(&node->ko);
    cond_1.p.super__Base_bitset<4UL>._M_w[3]._3_1_ = dVar1 < pNVar5->freq;
    if ((node->use_equ & 1U) == 0) {
      Cond::Cond((Cond *)&res_3,(uchar)node->beg,0xff);
      if ((cond_1.p.super__Base_bitset<4UL>._M_w[3]._3_1_ & 1) == 0) {
        pIVar6 = (InstructionCond *)operator_new(0x1c0);
        ok._7_1_ = 1;
        Context::Context(&local_6f8,0);
        Cond::operator~(&local_718,(Cond *)&res_3);
        InstructionCond(pIVar6,&local_6f8,&local_718,cond_1.p.super__Base_bitset<4UL>._M_w[3]._4_4_,
                        not_in);
        ok._7_1_ = 0;
        pIVar6 = PtrPool<Hpipe::Instruction,32>::operator<<
                           ((PtrPool<Hpipe::Instruction,32> *)inst_pool,pIVar6);
        Context::~Context(&local_6f8);
        local_688 = pIVar6;
        pNVar5 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ok);
        Cond::operator|((Cond *)&ko,not_in,(Cond *)&res_3);
        local_728 = make_cond(pNVar5,inst_pool,(Cond *)&ko,in_a_cycle,mark,
                              cond_1.p.super__Base_bitset<4UL>._M_w[3]._4_4_);
        pNVar5 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ko);
        Cond::operator~(&local_790,(Cond *)&res_3);
        Cond::operator|(&local_770,not_in,&local_790);
        local_750 = make_cond(pNVar5,inst_pool,&local_770,in_a_cycle,mark,
                              cond_1.p.super__Base_bitset<4UL>._M_w[3]._4_4_);
        pIVar3 = local_728;
        pIVar2 = &local_688->super_Instruction;
        Vec<unsigned_int>::Vec(&local_7d0);
        pNVar5 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::operator->(&node->ok);
        Transition::Transition(&local_7b8,pIVar3,&local_7d0,pNVar5->freq);
        Vec<Hpipe::Transition>::operator<<(&pIVar2->next,&local_7b8);
        Transition::~Transition(&local_7b8);
        Vec<unsigned_int>::~Vec(&local_7d0);
        pIVar6 = local_688;
        pVVar7 = &local_728->prev;
        Vec<unsigned_int>::Vec(&local_810);
        Transition::Transition(&local_7f8,&pIVar6->super_Instruction,&local_810,-1.0);
        Vec<Hpipe::Transition>::operator<<(pVVar7,&local_7f8);
        Transition::~Transition(&local_7f8);
        Vec<unsigned_int>::~Vec(&local_810);
        pIVar3 = local_750;
        pIVar2 = &local_688->super_Instruction;
        Vec<unsigned_int>::Vec(&local_850);
        pNVar5 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::operator->(&node->ko);
        Transition::Transition(&local_838,pIVar3,&local_850,pNVar5->freq);
        Vec<Hpipe::Transition>::operator<<(&pIVar2->next,&local_838);
        Transition::~Transition(&local_838);
        Vec<unsigned_int>::~Vec(&local_850);
        pIVar6 = local_688;
        pVVar7 = &local_750->prev;
        Vec<unsigned_int>::Vec(&local_890);
        Transition::Transition(&local_878,&pIVar6->super_Instruction,&local_890,-1.0);
        Vec<Hpipe::Transition>::operator<<(pVVar7,&local_878);
        Transition::~Transition(&local_878);
        Vec<unsigned_int>::~Vec(&local_890);
        (local_688->super_Instruction).in_a_cycle = in_a_cycle;
        (local_688->super_Instruction).mark = mark;
        node_local = (Node *)local_688;
      }
      else {
        pIVar6 = (InstructionCond *)operator_new(0x1c0);
        ko_3._7_1_ = 1;
        Context::Context(&local_508,0);
        InstructionCond(pIVar6,&local_508,(Cond *)&res_3,
                        cond_1.p.super__Base_bitset<4UL>._M_w[3]._4_4_,not_in);
        ko_3._7_1_ = 0;
        pIVar6 = PtrPool<Hpipe::Instruction,32>::operator<<
                           ((PtrPool<Hpipe::Instruction,32> *)inst_pool,pIVar6);
        Context::~Context(&local_508);
        local_498 = pIVar6;
        pNVar5 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ko);
        Cond::operator~((Cond *)&ok_3,(Cond *)&res_3);
        Cond::operator|(&local_538,not_in,(Cond *)&ok_3);
        local_518 = make_cond(pNVar5,inst_pool,&local_538,in_a_cycle,mark,
                              cond_1.p.super__Base_bitset<4UL>._M_w[3]._4_4_);
        pNVar5 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ok);
        Cond::operator|(&local_580,not_in,(Cond *)&res_3);
        local_560 = make_cond(pNVar5,inst_pool,&local_580,in_a_cycle,mark,
                              cond_1.p.super__Base_bitset<4UL>._M_w[3]._4_4_);
        pIVar3 = local_518;
        pIVar2 = &local_498->super_Instruction;
        Vec<unsigned_int>::Vec(&local_5c0);
        pNVar5 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::operator->(&node->ko);
        Transition::Transition(&local_5a8,pIVar3,&local_5c0,pNVar5->freq);
        Vec<Hpipe::Transition>::operator<<(&pIVar2->next,&local_5a8);
        Transition::~Transition(&local_5a8);
        Vec<unsigned_int>::~Vec(&local_5c0);
        pIVar6 = local_498;
        pVVar7 = &local_518->prev;
        Vec<unsigned_int>::Vec(&local_600);
        Transition::Transition(&local_5e8,&pIVar6->super_Instruction,&local_600,-1.0);
        Vec<Hpipe::Transition>::operator<<(pVVar7,&local_5e8);
        Transition::~Transition(&local_5e8);
        Vec<unsigned_int>::~Vec(&local_600);
        pIVar3 = local_560;
        pIVar2 = &local_498->super_Instruction;
        Vec<unsigned_int>::Vec(&local_640);
        pNVar5 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::operator->(&node->ok);
        Transition::Transition(&local_628,pIVar3,&local_640,pNVar5->freq);
        Vec<Hpipe::Transition>::operator<<(&pIVar2->next,&local_628);
        Transition::~Transition(&local_628);
        Vec<unsigned_int>::~Vec(&local_640);
        pIVar6 = local_498;
        pVVar7 = &local_560->prev;
        Vec<unsigned_int>::Vec((Vec<unsigned_int> *)&res);
        Transition::Transition(&local_668,&pIVar6->super_Instruction,(Vec<unsigned_int> *)&res,-1.0)
        ;
        Vec<Hpipe::Transition>::operator<<(pVVar7,&local_668);
        Transition::~Transition(&local_668);
        Vec<unsigned_int>::~Vec((Vec<unsigned_int> *)&res);
        (local_498->super_Instruction).in_a_cycle = in_a_cycle;
        (local_498->super_Instruction).mark = mark;
        node_local = (Node *)local_498;
      }
    }
    else {
      Cond::Cond((Cond *)&res_2,(uchar)node->beg,(uchar)node->beg);
      if ((cond_1.p.super__Base_bitset<4UL>._M_w[3]._3_1_ & 1) == 0) {
        pIVar6 = (InstructionCond *)operator_new(0x1c0);
        ok_1._7_1_ = 1;
        Context::Context(&local_2f8,0);
        InstructionCond(pIVar6,&local_2f8,(Cond *)&res_2,
                        cond_1.p.super__Base_bitset<4UL>._M_w[3]._4_4_,not_in);
        ok_1._7_1_ = 0;
        pIVar6 = PtrPool<Hpipe::Instruction,32>::operator<<
                           ((PtrPool<Hpipe::Instruction,32> *)inst_pool,pIVar6);
        Context::~Context(&local_2f8);
        local_288 = pIVar6;
        pNVar5 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ok);
        Cond::operator~((Cond *)&ko_1,(Cond *)&res_2);
        Cond::operator|(&local_328,not_in,(Cond *)&ko_1);
        local_308 = make_cond(pNVar5,inst_pool,&local_328,in_a_cycle,mark,
                              cond_1.p.super__Base_bitset<4UL>._M_w[3]._4_4_);
        pNVar5 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ko);
        Cond::operator|(&local_370,not_in,(Cond *)&res_2);
        local_350 = make_cond(pNVar5,inst_pool,&local_370,in_a_cycle,mark,
                              cond_1.p.super__Base_bitset<4UL>._M_w[3]._4_4_);
        pIVar3 = local_308;
        pIVar2 = &local_288->super_Instruction;
        Vec<unsigned_int>::Vec(&local_3b0);
        pNVar5 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::operator->(&node->ok);
        Transition::Transition(&local_398,pIVar3,&local_3b0,pNVar5->freq);
        Vec<Hpipe::Transition>::operator<<(&pIVar2->next,&local_398);
        Transition::~Transition(&local_398);
        Vec<unsigned_int>::~Vec(&local_3b0);
        pIVar6 = local_288;
        pVVar7 = &local_308->prev;
        Vec<unsigned_int>::Vec(&local_3f0);
        Transition::Transition(&local_3d8,&pIVar6->super_Instruction,&local_3f0,-1.0);
        Vec<Hpipe::Transition>::operator<<(pVVar7,&local_3d8);
        Transition::~Transition(&local_3d8);
        Vec<unsigned_int>::~Vec(&local_3f0);
        pIVar3 = local_350;
        pIVar2 = &local_288->super_Instruction;
        Vec<unsigned_int>::Vec(&local_430);
        pNVar5 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::operator->(&node->ko);
        Transition::Transition(&local_418,pIVar3,&local_430,pNVar5->freq);
        Vec<Hpipe::Transition>::operator<<(&pIVar2->next,&local_418);
        Transition::~Transition(&local_418);
        Vec<unsigned_int>::~Vec(&local_430);
        pIVar6 = local_288;
        pVVar7 = &local_350->prev;
        this = cond.p.super__Base_bitset<4UL>._M_w + 3;
        Vec<unsigned_int>::Vec((Vec<unsigned_int> *)this);
        Transition::Transition(&local_458,&pIVar6->super_Instruction,(Vec<unsigned_int> *)this,-1.0)
        ;
        Vec<Hpipe::Transition>::operator<<(pVVar7,&local_458);
        Transition::~Transition(&local_458);
        Vec<unsigned_int>::~Vec((Vec<unsigned_int> *)(cond.p.super__Base_bitset<4UL>._M_w + 3));
        (local_288->super_Instruction).in_a_cycle = in_a_cycle;
        (local_288->super_Instruction).mark = mark;
        node_local = (Node *)local_288;
      }
      else {
        pIVar6 = (InstructionCond *)operator_new(0x1c0);
        ko_2._7_1_ = 1;
        Context::Context(&local_d8,0);
        Cond::operator~(&local_108,(Cond *)&res_2);
        InstructionCond(pIVar6,&local_d8,&local_108,cond_1.p.super__Base_bitset<4UL>._M_w[3]._4_4_,
                        not_in);
        ko_2._7_1_ = 0;
        pIVar6 = PtrPool<Hpipe::Instruction,32>::operator<<
                           ((PtrPool<Hpipe::Instruction,32> *)inst_pool,pIVar6);
        Context::~Context(&local_d8);
        local_68 = pIVar6;
        pNVar5 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ko);
        Cond::operator|((Cond *)&ok_2,not_in,(Cond *)&res_2);
        local_118 = make_cond(pNVar5,inst_pool,(Cond *)&ok_2,in_a_cycle,mark,
                              cond_1.p.super__Base_bitset<4UL>._M_w[3]._4_4_);
        pNVar5 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ok);
        Cond::operator~(&local_180,(Cond *)&res_2);
        Cond::operator|(&local_160,not_in,&local_180);
        local_140 = make_cond(pNVar5,inst_pool,&local_160,in_a_cycle,mark,
                              cond_1.p.super__Base_bitset<4UL>._M_w[3]._4_4_);
        pIVar3 = local_118;
        pIVar2 = &local_68->super_Instruction;
        Vec<unsigned_int>::Vec(&local_1c0);
        pNVar5 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::operator->(&node->ko);
        Transition::Transition(&local_1a8,pIVar3,&local_1c0,pNVar5->freq);
        Vec<Hpipe::Transition>::operator<<(&pIVar2->next,&local_1a8);
        Transition::~Transition(&local_1a8);
        Vec<unsigned_int>::~Vec(&local_1c0);
        pIVar6 = local_68;
        pVVar7 = &local_118->prev;
        Vec<unsigned_int>::Vec(&local_200);
        Transition::Transition(&local_1e8,&pIVar6->super_Instruction,&local_200,-1.0);
        Vec<Hpipe::Transition>::operator<<(pVVar7,&local_1e8);
        Transition::~Transition(&local_1e8);
        Vec<unsigned_int>::~Vec(&local_200);
        pIVar3 = local_140;
        pIVar2 = &local_68->super_Instruction;
        Vec<unsigned_int>::Vec(&local_240);
        pNVar5 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::operator->(&node->ok);
        Transition::Transition(&local_228,pIVar3,&local_240,pNVar5->freq);
        Vec<Hpipe::Transition>::operator<<(&pIVar2->next,&local_228);
        Transition::~Transition(&local_228);
        Vec<unsigned_int>::~Vec(&local_240);
        pIVar6 = local_68;
        pVVar7 = &local_140->prev;
        Vec<unsigned_int>::Vec((Vec<unsigned_int> *)&res_1);
        Transition::Transition
                  (&local_268,&pIVar6->super_Instruction,(Vec<unsigned_int> *)&res_1,-1.0);
        Vec<Hpipe::Transition>::operator<<(pVVar7,&local_268);
        Transition::~Transition(&local_268);
        Vec<unsigned_int>::~Vec((Vec<unsigned_int> *)&res_1);
        (local_68->super_Instruction).in_a_cycle = in_a_cycle;
        (local_68->super_Instruction).mark = mark;
        node_local = (Node *)local_68;
      }
    }
  }
  else {
    node_local = (Node *)node->inst;
  }
  return (Instruction *)node_local;
}

Assistant:

Instruction *InstructionCond::make_cond( const BranchSet::Node *node, PtrPool<Instruction> &inst_pool, const Cond &not_in, bool in_a_cycle, InstructionMark *mark, int off_data ) {
    if ( node->ok ) {
        bool use_neg = node->ok->freq < node->ko->freq;
        if ( node->use_equ ) {
            Cond cond( node->beg, node->beg );
            if ( use_neg ) {
                Instruction *res = inst_pool << new InstructionCond( {}, ~ cond, off_data, not_in );
                Instruction *ko = make_cond( node->ko.ptr(), inst_pool, not_in |   cond, in_a_cycle, mark, off_data );
                Instruction *ok = make_cond( node->ok.ptr(), inst_pool, not_in | ~ cond, in_a_cycle, mark, off_data );
                res->next << Transition( ko, {}, node->ko->freq ); ko->prev << res;
                res->next << Transition( ok, {}, node->ok->freq ); ok->prev << res;
                res->in_a_cycle = in_a_cycle;
                res->mark = mark;
                return res;
            }
            Instruction *res = inst_pool << new InstructionCond( {}, cond, off_data, not_in );
            Instruction *ok = make_cond( node->ok.ptr(), inst_pool, not_in | ~ cond, in_a_cycle, mark, off_data );
            Instruction *ko = make_cond( node->ko.ptr(), inst_pool, not_in |   cond, in_a_cycle, mark, off_data );
            res->next << Transition( ok, {}, node->ok->freq ); ok->prev << res;
            res->next << Transition( ko, {}, node->ko->freq ); ko->prev << res;
            res->in_a_cycle = in_a_cycle;
            res->mark = mark;
            return res;
        }
        Cond cond( node->beg, 255 );
        if ( use_neg ) {
            Instruction *res = inst_pool << new InstructionCond( {}, cond, off_data, not_in );
            Instruction *ko = make_cond( node->ko.ptr(), inst_pool, not_in | ~ cond, in_a_cycle, mark, off_data );
            Instruction *ok = make_cond( node->ok.ptr(), inst_pool, not_in |   cond, in_a_cycle, mark, off_data );
            res->next << Transition( ko, {}, node->ko->freq ); ko->prev << res;
            res->next << Transition( ok, {}, node->ok->freq ); ok->prev << res;
            res->in_a_cycle = in_a_cycle;
            res->mark = mark;
            return res;
        }
        Instruction *res = inst_pool << new InstructionCond( {}, ~ cond, off_data, not_in );
        Instruction *ok = make_cond( node->ok.ptr(), inst_pool, not_in |   cond, in_a_cycle, mark, off_data );
        Instruction *ko = make_cond( node->ko.ptr(), inst_pool, not_in | ~ cond, in_a_cycle, mark, off_data );
        res->next << Transition( ok, {}, node->ok->freq ); ok->prev << res;
        res->next << Transition( ko, {}, node->ko->freq ); ko->prev << res;
        res->in_a_cycle = in_a_cycle;
        res->mark = mark;
        return res;
    }
    return node->inst;
}